

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_channel_converter_process_pcm_frames
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  uint uVar13;
  ma_format mVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ma_uint64 mVar22;
  undefined1 uVar23;
  ulong uVar24;
  undefined2 uVar25;
  long lVar26;
  ulong uVar27;
  byte *pbVar28;
  undefined4 uVar29;
  undefined1 auVar30 [16];
  int iVar31;
  float fVar32;
  undefined1 in_XMM1 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar48;
  int iVar51;
  undefined1 auVar49 [16];
  int iVar52;
  undefined1 auVar50 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  auVar30 = _DAT_0017f180;
  auVar11 = _DAT_00178d90;
  auVar10 = _DAT_00178d70;
  auVar9 = _DAT_00178d60;
  if (pFramesOut == (void *)0x0 || pConverter == (ma_channel_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pFramesIn == (void *)0x0) {
    sVar18 = (*(int *)(&DAT_0017b4a0 + (ulong)pConverter->format * 4) * pConverter->channelsOut) *
             frameCount;
    if (sVar18 != 0) {
      memset(pFramesOut,0,sVar18);
      return MA_SUCCESS;
    }
  }
  else {
    switch(pConverter->conversionPath) {
    case ma_channel_conversion_path_passthrough:
      memcpy(pFramesOut,pFramesIn,
             (*(int *)(&DAT_0017b4a0 + (ulong)pConverter->format * 4) * pConverter->channelsOut) *
             frameCount);
      break;
    case ma_channel_conversion_path_mono_out:
      uVar13 = pConverter->format - ma_format_u8;
      if (4 < uVar13) {
switchD_00142bde_default:
        return MA_INVALID_OPERATION;
      }
      uVar16 = (long)&switchD_00142b29::switchdataD_0017a7c4 +
               (long)(int)(&switchD_00142b29::switchdataD_0017a7c4)[uVar13];
      switch(pConverter->format) {
      case ma_format_u8:
        if (frameCount != 0) {
          mVar22 = 0;
          do {
            uVar16 = (ulong)pConverter->channelsIn;
            uVar13 = 0;
            if (uVar16 != 0) {
              uVar27 = 0;
              uVar13 = 0;
              do {
                uVar13 = (uVar13 + *(byte *)((long)pFramesIn + uVar27 + mVar22 * uVar16)) - 0x80;
                uVar27 = uVar27 + 1;
              } while (uVar16 != uVar27);
            }
            uVar13 = uVar13 / pConverter->channelsOut;
            if (0x7e < (int)uVar13) {
              uVar13 = 0x7f;
            }
            cVar12 = (char)uVar13;
            if ((int)uVar13 < -0x7f) {
              cVar12 = -0x80;
            }
            *(char *)((long)pFramesOut + mVar22) = cVar12 + -0x80;
            mVar22 = mVar22 + 1;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s16:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsIn;
          uVar16 = (ulong)uVar13;
          mVar22 = 0;
          do {
            uVar15 = 0;
            if (uVar16 != 0) {
              uVar27 = 0;
              uVar15 = 0;
              do {
                uVar15 = uVar15 + (int)*(short *)((long)pFramesIn + uVar27 * 2);
                uVar27 = uVar27 + 1;
              } while (uVar16 != uVar27);
            }
            *(short *)((long)pFramesOut + mVar22 * 2) = (short)(uVar15 / uVar13);
            mVar22 = mVar22 + 1;
            pFramesIn = (void *)((long)pFramesIn + uVar16 * 2);
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s24:
        if (frameCount != 0) {
          lVar21 = 0;
          mVar22 = 0;
          do {
            uVar13 = (uint)uVar16;
            uVar16 = (ulong)pConverter->channelsIn;
            if (uVar16 != 0) {
              lVar26 = 0;
              lVar17 = 0;
              do {
                lVar17 = lVar17 + ((long)((ulong)*(byte *)((long)pFramesIn +
                                                          lVar26 + lVar21 * uVar16 + 2) << 0x38 |
                                         (ulong)*(ushort *)
                                                 ((long)pFramesIn + lVar26 + lVar21 * uVar16) <<
                                         0x28) >> 0x28);
                lVar26 = lVar26 + 3;
              } while (uVar16 * 3 != lVar26);
              uVar13 = (uint)(lVar17 / (long)uVar16);
            }
            lVar17 = mVar22 * 3;
            *(char *)((long)pFramesOut + lVar17) = (char)uVar13;
            *(char *)((long)pFramesOut + lVar17 + 1) = (char)(uVar13 >> 8);
            uVar16 = (ulong)(uVar13 >> 0x10);
            *(char *)((long)pFramesOut + lVar17 + 2) = (char)(uVar13 >> 0x10);
            mVar22 = mVar22 + 1;
            lVar21 = lVar21 + 3;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s32:
        if (frameCount != 0) {
          lVar21 = 0;
          mVar22 = 0;
          do {
            uVar27 = (ulong)pConverter->channelsIn;
            if (uVar27 != 0) {
              uVar16 = 0;
              lVar17 = 0;
              do {
                lVar17 = lVar17 + *(int *)((long)pFramesIn + uVar16 * 4 + lVar21 * uVar27);
                uVar16 = uVar16 + 1;
              } while (uVar27 != uVar16);
              uVar16 = lVar17 / (long)uVar27;
            }
            *(int *)((long)pFramesOut + mVar22 * 4) = (int)uVar16;
            mVar22 = mVar22 + 1;
            lVar21 = lVar21 + 4;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_f32:
        if (frameCount != 0) {
          uVar16 = (ulong)pConverter->channelsIn;
          mVar22 = 0;
          do {
            fVar32 = 0.0;
            if (uVar16 != 0) {
              uVar27 = 0;
              do {
                fVar32 = fVar32 + *(float *)((long)pFramesIn + uVar27 * 4);
                uVar27 = uVar27 + 1;
              } while (uVar16 != uVar27);
            }
            *(float *)((long)pFramesOut + mVar22 * 4) = fVar32 / (float)uVar16;
            mVar22 = mVar22 + 1;
            pFramesIn = (void *)((long)pFramesIn + uVar16 * 4);
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
      }
      break;
    case ma_channel_conversion_path_mono_in:
      switch(pConverter->format) {
      case ma_format_u8:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsOut;
          mVar22 = 0;
          do {
            uVar15 = 0;
            if (uVar13 != 0) {
              uVar23 = *(undefined1 *)((long)pFramesIn + mVar22);
              uVar27 = 0;
              uVar16 = (ulong)uVar13;
              do {
                *(undefined1 *)((long)pFramesOut + uVar27 + uVar16 * mVar22) = uVar23;
                uVar27 = uVar27 + 1;
                uVar16 = (ulong)pConverter->channelsOut;
                uVar15 = pConverter->channelsOut;
              } while (uVar27 < uVar16);
            }
            uVar13 = uVar15;
            mVar22 = mVar22 + 1;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s16:
        uVar16 = (ulong)pConverter->channelsOut;
        if (uVar16 == 2) {
          if (frameCount != 0) {
            mVar22 = 0;
            do {
              uVar25 = *(undefined2 *)((long)pFramesIn + mVar22 * 2);
              *(undefined2 *)((long)pFramesOut + mVar22 * 4) = uVar25;
              *(undefined2 *)((long)pFramesOut + mVar22 * 4 + 2) = uVar25;
              mVar22 = mVar22 + 1;
            } while (frameCount != mVar22);
            return MA_SUCCESS;
          }
        }
        else if (frameCount != 0) {
          lVar21 = uVar16 - 1;
          auVar36._8_4_ = (int)lVar21;
          auVar36._0_8_ = lVar21;
          auVar36._12_4_ = (int)((ulong)lVar21 >> 0x20);
          lVar21 = (long)pFramesOut + 0xe;
          mVar22 = 0;
          auVar36 = auVar36 ^ _DAT_00178d70;
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          do {
            if (uVar16 != 0) {
              uVar25 = *(undefined2 *)((long)pFramesIn + mVar22 * 2);
              uVar27 = 0;
              auVar35 = auVar9;
              auVar37 = auVar11;
              auVar38 = auVar30;
              auVar39 = _DAT_0017f170;
              do {
                auVar40 = auVar35 ^ auVar10;
                iVar48 = auVar36._0_4_;
                iVar47 = -(uint)(iVar48 < auVar40._0_4_);
                iVar19 = auVar36._4_4_;
                auVar41._4_4_ = -(uint)(iVar19 < auVar40._4_4_);
                iVar52 = auVar36._8_4_;
                iVar51 = -(uint)(iVar52 < auVar40._8_4_);
                iVar31 = auVar36._12_4_;
                auVar41._12_4_ = -(uint)(iVar31 < auVar40._12_4_);
                auVar54._4_4_ = iVar47;
                auVar54._0_4_ = iVar47;
                auVar54._8_4_ = iVar51;
                auVar54._12_4_ = iVar51;
                auVar53 = pshuflw(in_XMM15,auVar54,0xe8);
                auVar43._4_4_ = -(uint)(auVar40._4_4_ == iVar19);
                auVar43._12_4_ = -(uint)(auVar40._12_4_ == iVar31);
                auVar43._0_4_ = auVar43._4_4_;
                auVar43._8_4_ = auVar43._12_4_;
                auVar40 = pshuflw(in_XMM1,auVar43,0xe8);
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar54 = pshuflw(auVar53,auVar41,0xe8);
                auVar40 = (auVar54 | auVar40 & auVar53) ^ auVar34;
                auVar40 = packssdw(auVar40,auVar40);
                if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + -0xe + uVar27) = uVar25;
                }
                auVar2._4_4_ = iVar47;
                auVar2._0_4_ = iVar47;
                auVar2._8_4_ = iVar51;
                auVar2._12_4_ = iVar51;
                auVar41 = auVar43 & auVar2 | auVar41;
                auVar53 = packssdw(auVar41,auVar41);
                auVar53 = packssdw(auVar53 ^ auVar34,auVar53 ^ auVar34);
                if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)(lVar21 + -0xc + uVar27) = uVar25;
                }
                auVar53 = auVar37 ^ auVar10;
                iVar47 = -(uint)(iVar48 < auVar53._0_4_);
                auVar49._4_4_ = -(uint)(iVar19 < auVar53._4_4_);
                iVar51 = -(uint)(iVar52 < auVar53._8_4_);
                auVar49._12_4_ = -(uint)(iVar31 < auVar53._12_4_);
                auVar42._4_4_ = iVar47;
                auVar42._0_4_ = iVar47;
                auVar42._8_4_ = iVar51;
                auVar42._12_4_ = iVar51;
                iVar47 = -(uint)(auVar53._4_4_ == iVar19);
                iVar51 = -(uint)(auVar53._12_4_ == iVar31);
                auVar3._4_4_ = iVar47;
                auVar3._0_4_ = iVar47;
                auVar3._8_4_ = iVar51;
                auVar3._12_4_ = iVar51;
                auVar49._0_4_ = auVar49._4_4_;
                auVar49._8_4_ = auVar49._12_4_;
                auVar53 = auVar3 & auVar42 | auVar49;
                auVar53 = packssdw(auVar53,auVar53);
                auVar53 = packssdw(auVar53 ^ auVar34,auVar53 ^ auVar34);
                if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + -10 + uVar27) = uVar25;
                }
                auVar53 = pshufhw(auVar53,auVar42,0x84);
                auVar4._4_4_ = iVar47;
                auVar4._0_4_ = iVar47;
                auVar4._8_4_ = iVar51;
                auVar4._12_4_ = iVar51;
                auVar43 = pshufhw(auVar42,auVar4,0x84);
                auVar54 = pshufhw(auVar53,auVar49,0x84);
                auVar53 = (auVar54 | auVar43 & auVar53) ^ auVar34;
                auVar53 = packssdw(auVar53,auVar53);
                if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + -8 + uVar27) = uVar25;
                }
                auVar53 = auVar38 ^ auVar10;
                iVar47 = -(uint)(iVar48 < auVar53._0_4_);
                auVar45._4_4_ = -(uint)(iVar19 < auVar53._4_4_);
                iVar51 = -(uint)(iVar52 < auVar53._8_4_);
                auVar45._12_4_ = -(uint)(iVar31 < auVar53._12_4_);
                auVar5._4_4_ = iVar47;
                auVar5._0_4_ = iVar47;
                auVar5._8_4_ = iVar51;
                auVar5._12_4_ = iVar51;
                auVar54 = pshuflw(auVar40,auVar5,0xe8);
                auVar33._0_4_ = -(uint)(auVar53._0_4_ == iVar48);
                auVar33._4_4_ = -(uint)(auVar53._4_4_ == iVar19);
                auVar33._8_4_ = -(uint)(auVar53._8_4_ == iVar52);
                auVar33._12_4_ = -(uint)(auVar53._12_4_ == iVar31);
                auVar44._4_4_ = auVar33._4_4_;
                auVar44._0_4_ = auVar33._4_4_;
                auVar44._8_4_ = auVar33._12_4_;
                auVar44._12_4_ = auVar33._12_4_;
                auVar40 = pshuflw(auVar33,auVar44,0xe8);
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar53 = pshuflw(auVar54,auVar45,0xe8);
                in_XMM15 = (auVar53 | auVar40 & auVar54) ^ auVar34;
                auVar40 = packssdw(auVar40 & auVar54,in_XMM15);
                if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + -6 + uVar27) = uVar25;
                }
                auVar6._4_4_ = iVar47;
                auVar6._0_4_ = iVar47;
                auVar6._8_4_ = iVar51;
                auVar6._12_4_ = iVar51;
                auVar45 = auVar44 & auVar6 | auVar45;
                auVar53 = packssdw(auVar45,auVar45);
                auVar40 = packssdw(auVar40,auVar53 ^ auVar34);
                if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + -4 + uVar27) = uVar25;
                }
                auVar40 = auVar39 ^ auVar10;
                iVar48 = -(uint)(iVar48 < auVar40._0_4_);
                auVar50._4_4_ = -(uint)(iVar19 < auVar40._4_4_);
                iVar52 = -(uint)(iVar52 < auVar40._8_4_);
                auVar50._12_4_ = -(uint)(iVar31 < auVar40._12_4_);
                auVar46._4_4_ = iVar48;
                auVar46._0_4_ = iVar48;
                auVar46._8_4_ = iVar52;
                auVar46._12_4_ = iVar52;
                iVar48 = -(uint)(auVar40._4_4_ == iVar19);
                iVar19 = -(uint)(auVar40._12_4_ == iVar31);
                auVar7._4_4_ = iVar48;
                auVar7._0_4_ = iVar48;
                auVar7._8_4_ = iVar19;
                auVar7._12_4_ = iVar19;
                auVar50._0_4_ = auVar50._4_4_;
                auVar50._8_4_ = auVar50._12_4_;
                auVar40 = auVar7 & auVar46 | auVar50;
                auVar40 = packssdw(auVar40,auVar40);
                auVar40 = packssdw(auVar40 ^ auVar34,auVar40 ^ auVar34);
                if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + -2 + uVar27) = uVar25;
                }
                auVar40 = pshufhw(auVar40,auVar46,0x84);
                auVar8._4_4_ = iVar48;
                auVar8._0_4_ = iVar48;
                auVar8._8_4_ = iVar19;
                auVar8._12_4_ = iVar19;
                auVar54 = pshufhw(auVar46,auVar8,0x84);
                auVar53 = pshufhw(auVar40,auVar50,0x84);
                auVar40 = (auVar53 | auVar54 & auVar40) ^ auVar34;
                in_XMM1 = packssdw(auVar40,auVar40);
                if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(lVar21 + uVar27) = uVar25;
                }
                lVar17 = auVar35._8_8_;
                auVar35._0_8_ = auVar35._0_8_ + 8;
                auVar35._8_8_ = lVar17 + 8;
                lVar17 = auVar37._8_8_;
                auVar37._0_8_ = auVar37._0_8_ + 8;
                auVar37._8_8_ = lVar17 + 8;
                lVar17 = auVar38._8_8_;
                auVar38._0_8_ = auVar38._0_8_ + 8;
                auVar38._8_8_ = lVar17 + 8;
                lVar17 = auVar39._8_8_;
                auVar39._0_8_ = auVar39._0_8_ + 8;
                auVar39._8_8_ = lVar17 + 8;
                uVar27 = uVar27 + 0x10;
              } while ((uVar16 * 2 + 0xe & 0xfffffffffffffff0) != uVar27);
            }
            mVar22 = mVar22 + 1;
            lVar21 = lVar21 + uVar16 * 2;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s24:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsOut;
          mVar22 = 0;
          do {
            uVar15 = 0;
            if (uVar13 != 0) {
              lVar21 = mVar22 * 3;
              uVar16 = 0;
              uVar27 = (ulong)uVar13;
              do {
                lVar17 = (uVar27 * mVar22 + uVar16) * 3;
                *(undefined1 *)((long)pFramesOut + lVar17) =
                     *(undefined1 *)((long)pFramesIn + lVar21);
                *(undefined1 *)((long)pFramesOut + lVar17 + 1) =
                     *(undefined1 *)((long)pFramesIn + lVar21 + 1);
                *(undefined1 *)((long)pFramesOut + lVar17 + 2) =
                     *(undefined1 *)((long)pFramesIn + lVar21 + 2);
                uVar16 = uVar16 + 1;
                uVar27 = (ulong)pConverter->channelsOut;
                uVar15 = pConverter->channelsOut;
              } while (uVar16 < uVar27);
            }
            uVar13 = uVar15;
            mVar22 = mVar22 + 1;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s32:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsOut;
          lVar21 = 0;
          mVar22 = 0;
          do {
            uVar15 = 0;
            if (uVar13 != 0) {
              uVar29 = *(undefined4 *)((long)pFramesIn + mVar22 * 4);
              uVar27 = 0;
              uVar16 = (ulong)uVar13;
              do {
                *(undefined4 *)((long)pFramesOut + uVar27 * 4 + uVar16 * lVar21) = uVar29;
                uVar27 = uVar27 + 1;
                uVar16 = (ulong)pConverter->channelsOut;
                uVar15 = pConverter->channelsOut;
              } while (uVar27 < uVar16);
            }
            uVar13 = uVar15;
            mVar22 = mVar22 + 1;
            lVar21 = lVar21 + 4;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_f32:
        uVar16 = (ulong)pConverter->channelsOut;
        if (uVar16 == 2) {
          if (frameCount != 0) {
            mVar22 = 0;
            do {
              uVar29 = *(undefined4 *)((long)pFramesIn + mVar22 * 4);
              *(undefined4 *)((long)pFramesOut + mVar22 * 8) = uVar29;
              *(undefined4 *)((long)pFramesOut + mVar22 * 8 + 4) = uVar29;
              mVar22 = mVar22 + 1;
            } while (frameCount != mVar22);
            return MA_SUCCESS;
          }
        }
        else if (frameCount != 0) {
          lVar21 = uVar16 - 1;
          auVar30._8_4_ = (int)lVar21;
          auVar30._0_8_ = lVar21;
          auVar30._12_4_ = (int)((ulong)lVar21 >> 0x20);
          lVar21 = (long)pFramesOut + 0xc;
          mVar22 = 0;
          auVar30 = auVar30 ^ _DAT_00178d70;
          do {
            if (uVar16 != 0) {
              uVar29 = *(undefined4 *)((long)pFramesIn + mVar22 * 4);
              uVar27 = 0;
              auVar40 = auVar9;
              auVar53 = auVar11;
              do {
                auVar36 = auVar40 ^ auVar10;
                iVar48 = auVar30._4_4_;
                if ((bool)(~(auVar36._4_4_ == iVar48 && auVar30._0_4_ < auVar36._0_4_ ||
                            iVar48 < auVar36._4_4_) & 1)) {
                  *(undefined4 *)(lVar21 + -0xc + uVar27) = uVar29;
                }
                if ((auVar36._12_4_ != auVar30._12_4_ || auVar36._8_4_ <= auVar30._8_4_) &&
                    auVar36._12_4_ <= auVar30._12_4_) {
                  *(undefined4 *)(lVar21 + -8 + uVar27) = uVar29;
                }
                iVar19 = SUB164(auVar53 ^ auVar10,4);
                if (iVar19 <= iVar48 &&
                    (iVar19 != iVar48 || SUB164(auVar53 ^ auVar10,0) <= auVar30._0_4_)) {
                  *(undefined4 *)(lVar21 + -4 + uVar27) = uVar29;
                  *(undefined4 *)(lVar21 + uVar27) = uVar29;
                }
                lVar17 = auVar40._8_8_;
                auVar40._0_8_ = auVar40._0_8_ + 4;
                auVar40._8_8_ = lVar17 + 4;
                lVar17 = auVar53._8_8_;
                auVar53._0_8_ = auVar53._0_8_ + 4;
                auVar53._8_8_ = lVar17 + 4;
                uVar27 = uVar27 + 0x10;
              } while ((uVar16 * 4 + 0xc & 0xfffffffffffffff0) != uVar27);
            }
            mVar22 = mVar22 + 1;
            lVar21 = lVar21 + uVar16 * 4;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      default:
        goto switchD_00142bde_default;
      }
      break;
    case ma_channel_conversion_path_shuffle:
      uVar13 = pConverter->channelsOut;
      uVar16 = (ulong)uVar13;
      pbVar1 = pConverter->pShuffleTable;
      if (pbVar1 == (byte *)0x0 || uVar16 == 0) {
        return MA_INVALID_ARGS;
      }
      if (4 < pConverter->format - ma_format_u8) {
        return MA_INVALID_ARGS;
      }
      uVar15 = pConverter->channelsIn;
      uVar27 = (ulong)uVar15;
      switch(pConverter->format) {
      case ma_format_u8:
        if (frameCount != 0) {
          mVar22 = 0;
          do {
            uVar20 = 0;
            do {
              if (pbVar1[uVar20] < uVar15) {
                uVar23 = *(undefined1 *)((long)pFramesIn + (ulong)pbVar1[uVar20]);
              }
              else {
                uVar23 = 0;
              }
              *(undefined1 *)((long)pFramesOut + uVar20) = uVar23;
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
            pFramesOut = (void *)((long)pFramesOut + uVar16);
            pFramesIn = (void *)((long)pFramesIn + uVar27);
            mVar22 = mVar22 + 1;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s16:
        if (frameCount != 0) {
          mVar22 = 0;
          do {
            uVar20 = 0;
            do {
              if (pbVar1[uVar20] < uVar15) {
                uVar25 = *(undefined2 *)((long)pFramesIn + (ulong)pbVar1[uVar20] * 2);
              }
              else {
                uVar25 = 0;
              }
              *(undefined2 *)((long)pFramesOut + uVar20 * 2) = uVar25;
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
            pFramesIn = (void *)((long)pFramesIn + uVar27 * 2);
            mVar22 = mVar22 + 1;
            pFramesOut = (void *)((long)pFramesOut + uVar16 * 2);
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s24:
        if (frameCount != 0) {
          mVar22 = 0;
          do {
            uVar27 = 0;
            pbVar28 = pbVar1;
            do {
              iVar48 = (int)uVar27;
              if (*pbVar28 < uVar15) {
                lVar21 = (ulong)*pbVar28 * 3;
                *(undefined1 *)((long)pFramesOut + (uVar27 & 0xffffffff)) =
                     *(undefined1 *)((long)pFramesIn + lVar21);
                uVar20 = (ulong)(iVar48 + 1);
                *(undefined1 *)((long)pFramesOut + uVar20) =
                     *(undefined1 *)((long)pFramesIn + lVar21 + 1);
                *(undefined1 *)((long)pFramesOut + (ulong)(iVar48 + 2)) =
                     *(undefined1 *)((long)pFramesIn + lVar21 + 2);
              }
              else {
                *(undefined1 *)((long)pFramesOut + (uVar27 & 0xffffffff)) = 0;
                uVar20 = (ulong)(iVar48 + 1);
              }
              *(undefined1 *)((long)pFramesOut + uVar20) = 0;
              uVar27 = uVar27 + 3;
              pbVar28 = pbVar28 + 1;
            } while (uVar16 * 3 != uVar27);
            *(undefined1 *)((long)pFramesOut + (ulong)(uVar13 * 3 + 2)) = 0;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(uVar13 * 3));
            pFramesIn = (void *)((long)pFramesIn + (ulong)(uVar15 * 3));
            mVar22 = mVar22 + 1;
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s32:
        if (frameCount != 0) {
          mVar22 = 0;
          do {
            uVar20 = 0;
            do {
              uVar29 = 0;
              if (pbVar1[uVar20] < uVar15) {
                uVar29 = *(undefined4 *)((long)pFramesIn + (ulong)pbVar1[uVar20] * 4);
              }
              *(undefined4 *)((long)pFramesOut + uVar20 * 4) = uVar29;
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
            pFramesIn = (void *)((long)pFramesIn + uVar27 * 4);
            mVar22 = mVar22 + 1;
            pFramesOut = (void *)((long)pFramesOut + uVar16 * 4);
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_f32:
        if (frameCount != 0) {
          mVar22 = 0;
          do {
            uVar20 = 0;
            do {
              uVar29 = 0;
              if (pbVar1[uVar20] < uVar15) {
                uVar29 = *(undefined4 *)((long)pFramesIn + (ulong)pbVar1[uVar20] * 4);
              }
              *(undefined4 *)((long)pFramesOut + uVar20 * 4) = uVar29;
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
            pFramesIn = (void *)((long)pFramesIn + uVar27 * 4);
            mVar22 = mVar22 + 1;
            pFramesOut = (void *)((long)pFramesOut + uVar16 * 4);
          } while (mVar22 != frameCount);
          return MA_SUCCESS;
        }
      }
      break;
    default:
      mVar14 = pConverter->format;
      sVar18 = (*(int *)(&DAT_0017b4a0 + (ulong)mVar14 * 4) * pConverter->channelsOut) * frameCount;
      if (sVar18 != 0) {
        memset(pFramesOut,0,sVar18);
        mVar14 = pConverter->format;
      }
      switch(mVar14) {
      case ma_format_u8:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsIn;
          uVar16 = 0;
          uVar15 = uVar13;
          do {
            iVar48 = (int)uVar16;
            if (uVar15 == 0) {
              uVar15 = 0;
            }
            else {
              uVar27 = (ulong)pConverter->channelsOut;
              uVar16 = 0;
              do {
                if ((int)uVar27 == 0) {
                  uVar27 = 0;
                }
                else {
                  uVar20 = 0;
                  do {
                    uVar27 = (ulong)(uint)((int)uVar27 * iVar48 + (int)uVar20);
                    iVar19 = ((int)((*(byte *)((long)pFramesIn +
                                              (ulong)(pConverter->channelsIn * iVar48 + (int)uVar16)
                                              ) - 0x80) *
                                   (int)(pConverter->weights).f32[uVar16][uVar20]) >> 0xc) +
                             (uint)*(byte *)((long)pFramesOut + uVar27) + -0x80;
                    if (iVar19 < -0x7f) {
                      iVar19 = -0x80;
                    }
                    if (0x7e < iVar19) {
                      iVar19 = 0x7f;
                    }
                    *(char *)((long)pFramesOut + uVar27) = (char)iVar19 + -0x80;
                    uVar20 = uVar20 + 1;
                    uVar27 = (ulong)pConverter->channelsOut;
                  } while (uVar20 < uVar27);
                  uVar13 = pConverter->channelsIn;
                }
                uVar16 = uVar16 + 1;
                uVar15 = uVar13;
              } while (uVar16 < uVar13);
            }
            uVar16 = (ulong)(iVar48 + 1);
          } while (uVar16 < frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s16:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsIn;
          uVar16 = 0;
          do {
            iVar48 = (int)uVar16;
            if ((ulong)uVar13 != 0) {
              uVar15 = pConverter->channelsOut;
              uVar16 = 0;
              do {
                if ((ulong)uVar15 != 0) {
                  uVar27 = 0;
                  do {
                    uVar20 = (ulong)(uVar15 * iVar48 + (int)uVar27);
                    iVar19 = ((int)*(short *)((long)pFramesIn +
                                             (ulong)(uVar13 * iVar48 + (int)uVar16) * 2) *
                              (int)(pConverter->weights).f32[uVar16][uVar27] >> 0xc) +
                             (int)*(short *)((long)pFramesOut + uVar20 * 2);
                    if (0x7ffe < iVar19) {
                      iVar19 = 0x7fff;
                    }
                    if (iVar19 < -0x7fff) {
                      iVar19 = -0x8000;
                    }
                    *(short *)((long)pFramesOut + uVar20 * 2) = (short)iVar19;
                    uVar27 = uVar27 + 1;
                  } while (uVar15 != uVar27);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar13);
            }
            uVar16 = (ulong)(iVar48 + 1);
          } while (uVar16 < frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s24:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsIn;
          uVar16 = 0;
          uVar15 = uVar13;
          do {
            iVar48 = (int)uVar16;
            if (uVar15 == 0) {
              uVar15 = 0;
            }
            else {
              uVar27 = (ulong)pConverter->channelsOut;
              uVar16 = 0;
              do {
                if ((int)uVar27 == 0) {
                  uVar27 = 0;
                }
                else {
                  uVar20 = 0;
                  do {
                    uVar27 = (ulong)(uint)(((int)uVar27 * iVar48 + (int)uVar20) * 3);
                    uVar24 = (ulong)((pConverter->channelsIn * iVar48 + (int)uVar16) * 3);
                    lVar21 = ((long)(int)(pConverter->weights).f32[uVar16][uVar20] *
                              ((long)((ulong)*(byte *)((long)pFramesIn + uVar24 + 2) << 0x38 |
                                     (ulong)*(ushort *)((long)pFramesIn + uVar24) << 0x28) >> 0x28)
                             >> 0xc) + ((long)((ulong)*(byte *)((long)pFramesOut + uVar27 + 2) <<
                                               0x38 | (ulong)*(ushort *)((long)pFramesOut + uVar27)
                                                      << 0x28) >> 0x28);
                    if (lVar21 < -0x7fffff) {
                      lVar21 = -0x800000;
                    }
                    if (0x7ffffe < lVar21) {
                      lVar21 = 0x7fffff;
                    }
                    *(char *)((long)pFramesOut + uVar27) = (char)lVar21;
                    *(char *)((long)pFramesOut + uVar27 + 1) = (char)((ulong)lVar21 >> 8);
                    *(char *)((long)pFramesOut + uVar27 + 2) = (char)((ulong)lVar21 >> 0x10);
                    uVar20 = uVar20 + 1;
                    uVar27 = (ulong)pConverter->channelsOut;
                  } while (uVar20 < uVar27);
                  uVar13 = pConverter->channelsIn;
                }
                uVar16 = uVar16 + 1;
                uVar15 = uVar13;
              } while (uVar16 < uVar13);
            }
            uVar16 = (ulong)(iVar48 + 1);
          } while (uVar16 < frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_s32:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsIn;
          uVar16 = 0;
          uVar15 = uVar13;
          do {
            iVar48 = (int)uVar16;
            if (uVar15 == 0) {
              uVar15 = 0;
            }
            else {
              uVar27 = (ulong)pConverter->channelsOut;
              uVar16 = 0;
              do {
                if ((int)uVar27 == 0) {
                  uVar27 = 0;
                }
                else {
                  uVar20 = 0;
                  do {
                    uVar27 = (ulong)(uint)((int)uVar27 * iVar48 + (int)uVar20);
                    lVar21 = ((long)(int)(pConverter->weights).f32[uVar16][uVar20] *
                              (long)*(int *)((long)pFramesIn +
                                            (ulong)(pConverter->channelsIn * iVar48 + (int)uVar16) *
                                            4) >> 0xc) +
                             (long)*(int *)((long)pFramesOut + uVar27 * 4);
                    if (0x7ffffffe < lVar21) {
                      lVar21 = 0x7fffffff;
                    }
                    if (lVar21 < -0x7fffffff) {
                      lVar21 = -0x80000000;
                    }
                    *(int *)((long)pFramesOut + uVar27 * 4) = (int)lVar21;
                    uVar20 = uVar20 + 1;
                    uVar27 = (ulong)pConverter->channelsOut;
                  } while (uVar20 < uVar27);
                  uVar13 = pConverter->channelsIn;
                }
                uVar16 = uVar16 + 1;
                uVar15 = uVar13;
              } while (uVar16 < uVar13);
            }
            uVar16 = (ulong)(iVar48 + 1);
          } while (uVar16 < frameCount);
          return MA_SUCCESS;
        }
        break;
      case ma_format_f32:
        if (frameCount != 0) {
          uVar13 = pConverter->channelsIn;
          uVar16 = 0;
          do {
            iVar48 = (int)uVar16;
            if ((ulong)uVar13 != 0) {
              uVar15 = pConverter->channelsOut;
              uVar16 = 0;
              do {
                if ((ulong)uVar15 != 0) {
                  uVar27 = 0;
                  do {
                    uVar20 = (ulong)(uVar15 * iVar48 + (int)uVar27);
                    *(float *)((long)pFramesOut + uVar20 * 4) =
                         *(float *)((long)pFramesIn + (ulong)(iVar48 * uVar13 + (int)uVar16) * 4) *
                         (pConverter->weights).f32[uVar16][uVar27] +
                         *(float *)((long)pFramesOut + uVar20 * 4);
                    uVar27 = uVar27 + 1;
                  } while (uVar15 != uVar27);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar13);
            }
            uVar16 = (ulong)(iVar48 + 1);
          } while (uVar16 < frameCount);
          return MA_SUCCESS;
        }
        break;
      default:
        goto switchD_00142bde_default;
      }
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_channel_converter_process_pcm_frames(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesOut == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesIn == NULL) {
        ma_zero_memory_64(pFramesOut, frameCount * ma_get_bytes_per_frame(pConverter->format, pConverter->channelsOut));
        return MA_SUCCESS;
    }

    switch (pConverter->conversionPath)
    {
        case ma_channel_conversion_path_passthrough: return ma_channel_converter_process_pcm_frames__passthrough(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_out:    return ma_channel_converter_process_pcm_frames__mono_out(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_in:     return ma_channel_converter_process_pcm_frames__mono_in(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_shuffle:     return ma_channel_converter_process_pcm_frames__shuffle(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_weights:
        default:
        {
            return ma_channel_converter_process_pcm_frames__weights(pConverter, pFramesOut, pFramesIn, frameCount);
        }
    }
}